

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

cmInstallFilesGenerator *
CreateInstallFilesGenerator
          (cmMakefile *mf,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles,cmInstallCommandArguments *args,bool programs)

{
  bool optional;
  char *dest;
  char *file_permissions;
  MessageLevel message;
  cmInstallFilesGenerator *this;
  string *psVar1;
  cmInstallCommandArguments *pcVar2;
  string *psVar3;
  cmInstallCommandArguments *pcVar4;
  
  message = cmInstallGenerator::SelectMessageLevel(mf,false);
  this = (cmInstallFilesGenerator *)operator_new(0x120);
  psVar1 = &cmInstallCommandArguments::EmptyString_abi_cxx11_;
  pcVar4 = args;
  do {
    if ((pcVar4->DestinationString)._M_string_length != 0) {
      psVar3 = &pcVar4->DestinationString;
      goto LAB_003e7aab;
    }
    pcVar4 = pcVar4->GenericArguments;
  } while (pcVar4 != (cmInstallCommandArguments *)0x0);
  psVar3 = &cmInstallCommandArguments::EmptyString_abi_cxx11_;
LAB_003e7aab:
  dest = (psVar3->_M_dataplus)._M_p;
  pcVar4 = args;
  do {
    if ((pcVar4->PermissionsString)._M_string_length != 0) {
      psVar1 = &pcVar4->PermissionsString;
      break;
    }
    pcVar4 = pcVar4->GenericArguments;
  } while (pcVar4 != (cmInstallCommandArguments *)0x0);
  file_permissions = (psVar1->_M_dataplus)._M_p;
  pcVar4 = args;
  do {
    pcVar2 = pcVar4;
    if ((pcVar2->Configurations).Vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pcVar2->Configurations).Vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    pcVar4 = pcVar2->GenericArguments;
  } while (pcVar2->GenericArguments != (cmInstallCommandArguments *)0x0);
  psVar1 = cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  psVar3 = &cmInstallCommandArguments::EmptyString_abi_cxx11_;
  pcVar4 = args;
  do {
    if ((pcVar4->Rename).String._M_string_length != 0) {
      psVar3 = &(pcVar4->Rename).String;
      break;
    }
    pcVar4 = pcVar4->GenericArguments;
  } while (pcVar4 != (cmInstallCommandArguments *)0x0);
  do {
    optional = (args->Optional).Enabled;
    if (optional != false) break;
    args = args->GenericArguments;
  } while (args != (cmInstallCommandArguments *)0x0);
  cmInstallFilesGenerator::cmInstallFilesGenerator
            (this,mf,absFiles,dest,programs,file_permissions,&(pcVar2->Configurations).Vector,
             (psVar1->_M_dataplus)._M_p,message,(psVar3->_M_dataplus)._M_p,optional);
  return this;
}

Assistant:

static cmInstallFilesGenerator* CreateInstallFilesGenerator(
  cmMakefile* mf,
    const std::vector<std::string>& absFiles,
    const cmInstallCommandArguments& args, bool programs)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(mf);
  return new cmInstallFilesGenerator(mf,
                        absFiles, args.GetDestination().c_str(),
                        programs, args.GetPermissions().c_str(),
                        args.GetConfigurations(), args.GetComponent().c_str(),
                        message,
                        args.GetRename().c_str(), args.GetOptional());
}